

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_ldm.cpp
# Opt level: O0

void duckdb_zstd::ZSTD_ldm_fillHashTable
               (ldmState_t *ldmState,BYTE *ip,BYTE *iend,ldmParams_t *params)

{
  ldmParams_t ldmParams;
  size_t *splits_00;
  size_t sVar1;
  ldmEntry_t entry_00;
  ldmState_t *ldmState_00;
  ldmParams_t *in_RCX;
  BYTE *in_RDX;
  BYTE *in_RSI;
  long in_RDI;
  unsigned_long_long in_stack_00000028;
  size_t in_stack_00000030;
  void *in_stack_00000038;
  ldmEntry_t entry;
  U32 hash;
  U64 xxhash;
  BYTE *split;
  uint n;
  size_t hashed;
  uint numSplits;
  size_t *splits;
  ldmRollingHashState_t hashState;
  BYTE *istart;
  BYTE *base;
  U32 hBits;
  U32 minMatchLength;
  uint local_64;
  undefined4 in_stack_ffffffffffffffa8;
  uint uVar2;
  ldmRollingHashState_t local_48;
  BYTE *local_38;
  undefined8 local_30;
  int local_28;
  U32 local_24;
  BYTE *local_18;
  BYTE *local_10;
  
  local_24 = in_RCX->minMatchLength;
  local_28 = in_RCX->hashLog - in_RCX->bucketSizeLog;
  local_30 = *(undefined8 *)(in_RDI + 8);
  splits_00 = (size_t *)(in_RDI + 0x40);
  local_38 = in_RSI;
  local_18 = in_RDX;
  local_10 = in_RSI;
  ZSTD_ldm_gear_init(&local_48,in_RCX);
  for (; local_10 < local_18; local_10 = local_10 + sVar1) {
    uVar2 = 0;
    sVar1 = ZSTD_ldm_gear_feed(&local_48,local_10,(long)local_18 - (long)local_10,splits_00,
                               (uint *)&stack0xffffffffffffffac);
    for (local_64 = 0; local_64 < uVar2; local_64 = local_64 + 1) {
      if (local_38 + local_24 <= local_10 + splits_00[local_64]) {
        entry_00 = (ldmEntry_t)((long)local_10 + (splits_00[local_64] - (ulong)local_24));
        ldmState_00 = (ldmState_t *)XXH64(in_stack_00000038,in_stack_00000030,in_stack_00000028);
        ldmParams.bucketSizeLog = in_stack_ffffffffffffffa8;
        ldmParams.enableLdm = (int)sVar1;
        ldmParams.hashLog = (int)(sVar1 >> 0x20);
        ldmParams.minMatchLength = uVar2;
        ldmParams._16_8_ = splits_00;
        ZSTD_ldm_insertEntry
                  (ldmState_00,
                   CONCAT44((uint)ldmState_00 & (1 << ((byte)local_28 & 0x1f)) - 1U,
                            (int)((ulong)ldmState_00 >> 0x20)),entry_00,ldmParams);
      }
    }
  }
  return;
}

Assistant:

void ZSTD_ldm_fillHashTable(
            ldmState_t* ldmState, const BYTE* ip,
            const BYTE* iend, ldmParams_t const* params)
{
    U32 const minMatchLength = params->minMatchLength;
    U32 const hBits = params->hashLog - params->bucketSizeLog;
    BYTE const* const base = ldmState->window.base;
    BYTE const* const istart = ip;
    ldmRollingHashState_t hashState;
    size_t* const splits = ldmState->splitIndices;
    unsigned numSplits;

    DEBUGLOG(5, "ZSTD_ldm_fillHashTable");

    ZSTD_ldm_gear_init(&hashState, params);
    while (ip < iend) {
        size_t hashed;
        unsigned n;

        numSplits = 0;
        hashed = ZSTD_ldm_gear_feed(&hashState, ip, iend - ip, splits, &numSplits);

        for (n = 0; n < numSplits; n++) {
            if (ip + splits[n] >= istart + minMatchLength) {
                BYTE const* const split = ip + splits[n] - minMatchLength;
                U64 const xxhash = XXH64(split, minMatchLength, 0);
                U32 const hash = (U32)(xxhash & (((U32)1 << hBits) - 1));
                ldmEntry_t entry;

                entry.offset = (U32)(split - base);
                entry.checksum = (U32)(xxhash >> 32);
                ZSTD_ldm_insertEntry(ldmState, hash, entry, *params);
            }
        }

        ip += hashed;
    }
}